

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

float3 ConvexDecomposition::operator*(Quaternion *q,float3 *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float3 fVar14;
  
  fVar1 = (q->super_float4).x;
  fVar2 = (q->super_float4).y;
  fVar3 = (q->super_float4).z;
  fVar4 = (q->super_float4).w;
  fVar5 = v->y;
  fVar6 = v->x;
  fVar7 = v->z;
  fVar9 = fVar1 * fVar2 - fVar4 * fVar3;
  fVar8 = fVar1 * fVar2 + fVar4 * fVar3;
  auVar13 = SUB6416(ZEXT464(0xc0000000),0);
  auVar11 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar1 * fVar1 + fVar3 * fVar3)),auVar13,
                                ZEXT416(0x3f800000));
  auVar12 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3)),auVar13,
                                ZEXT416(0x3f800000));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (fVar9 + fVar9))),ZEXT416((uint)fVar6),auVar12);
  fVar9 = fVar1 * fVar3 + fVar4 * fVar2;
  fVar10 = fVar1 * fVar3 - fVar4 * fVar2;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * auVar11._0_4_)),ZEXT416((uint)fVar6),
                            ZEXT416((uint)(fVar8 + fVar8)));
  fVar8 = fVar2 * fVar3 - fVar4 * fVar1;
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 + fVar9)),ZEXT416((uint)fVar7),auVar12);
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar8 + fVar8)),ZEXT416((uint)fVar7),auVar11);
  auVar12 = vinsertps_avx(auVar12,auVar11,0x10);
  fVar3 = fVar2 * fVar3 + fVar4 * fVar1;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (fVar3 + fVar3))),ZEXT416((uint)fVar6),
                            ZEXT416((uint)(fVar10 + fVar10)));
  auVar13 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2)),auVar13,
                                ZEXT416(0x3f800000));
  auVar11 = vfmadd213ss_fma(auVar13,ZEXT416((uint)fVar7),auVar11);
  fVar14._0_8_ = auVar12._0_8_;
  fVar14.z = auVar11._0_4_;
  return fVar14;
}

Assistant:

float3 operator*( const Quaternion& q, const float3& v )
{
	// The following is equivalent to:
	//return (q.getmatrix() * v);
	float qx2 = q.x*q.x;
	float qy2 = q.y*q.y;
	float qz2 = q.z*q.z;

	float qxqy = q.x*q.y;
	float qxqz = q.x*q.z;
	float qxqw = q.x*q.w;
	float qyqz = q.y*q.z;
	float qyqw = q.y*q.w;
	float qzqw = q.z*q.w;
	return float3(
		(1-2*(qy2+qz2))*v.x + (2*(qxqy-qzqw))*v.y + (2*(qxqz+qyqw))*v.z ,
		(2*(qxqy+qzqw))*v.x + (1-2*(qx2+qz2))*v.y + (2*(qyqz-qxqw))*v.z ,
		(2*(qxqz-qyqw))*v.x + (2*(qyqz+qxqw))*v.y + (1-2*(qx2+qy2))*v.z  );
}